

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

Rational * __thiscall
Polynom<Rational>::valueAt(Rational *__return_storage_ptr__,Polynom<Rational> *this,Rational *a)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 0;
  Rational::Rational(__return_storage_ptr__,0);
  for (uVar2 = 0; uVar2 < (this->m).N; uVar2 = uVar2 + 1) {
    Rational::operator*=(__return_storage_ptr__,a);
    Rational::operator+=
              (__return_storage_ptr__,
               (Rational *)
               ((long)&(((this->m).arr)->_numerator).digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

const Field Polynom<Field>::valueAt(Field a) const
{
    Field res = 0;
    for(unsigned i = 0; i < m.width(); ++i)
    {
        res *= a;
        res += m[0][i];
    }
    return res;
}